

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst,Instruction *operand_inst)

{
  iterator instr;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  BasicBlock *pBVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  TypeManager *this_00;
  Instruction *this_01;
  Instruction *this_02;
  iterator instr_00;
  InstructionBuilder builder;
  
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_Pass).context_,func_call_inst,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  pIVar6 = (func_call_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  instr_00.node_ = (Instruction *)0x0;
  if ((pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    instr_00.node_ = pIVar6;
  }
  pBVar4 = IRContext::get_instr_block((this->super_Pass).context_,func_call_inst);
  instr.node_ = *(Instruction **)
                 ((long)(((pBVar4->function_->blocks_).
                          super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 + 0x20);
  pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = Instruction::type_id(operand_inst);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar1);
  pDVar5 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar1 = Instruction::GetSingleWordInOperand(pIVar6,1);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar1);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = Instruction::result_id(pIVar6);
  uVar1 = analysis::TypeManager::FindPointerToType(this_00,uVar1,Function);
  builder.parent_ = IRContext::get_instr_block(builder.context_,instr.node_);
  builder.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
  this_01 = InstructionBuilder::AddVariable(&builder,uVar1,7);
  builder.parent_ = IRContext::get_instr_block(builder.context_,func_call_inst);
  builder.insert_before_.super_iterator.node_ = (iterator)(iterator)func_call_inst;
  uVar1 = Instruction::result_id(operand_inst);
  uVar2 = Instruction::result_id(pIVar6);
  this_02 = InstructionBuilder::AddLoad(&builder,uVar2,uVar1,0);
  uVar2 = Instruction::result_id(this_01);
  uVar3 = Instruction::result_id(this_02);
  InstructionBuilder::AddStore(&builder,uVar2,uVar3);
  builder.parent_ = IRContext::get_instr_block(builder.context_,instr_00.node_);
  builder.insert_before_.super_iterator.node_ = (iterator)(iterator)instr_00.node_;
  uVar2 = Instruction::result_id(pIVar6);
  uVar3 = Instruction::result_id(this_01);
  pIVar6 = InstructionBuilder::AddLoad(&builder,uVar2,uVar3,0);
  uVar2 = Instruction::result_id(pIVar6);
  InstructionBuilder::AddStore(&builder,uVar1,uVar2);
  uVar1 = Instruction::result_id(this_01);
  return uVar1;
}

Assistant:

uint32_t FixFuncCallArgumentsPass::ReplaceAccessChainFuncCallArguments(
    Instruction* func_call_inst, Instruction* operand_inst) {
  InstructionBuilder builder(
      context(), func_call_inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  Instruction* next_insert_point = func_call_inst->NextNode();
  // Get Variable insertion point
  Function* func = context()->get_instr_block(func_call_inst)->GetParent();
  Instruction* variable_insertion_point = &*(func->begin()->begin());
  Instruction* op_ptr_type = get_def_use_mgr()->GetDef(operand_inst->type_id());
  Instruction* op_type =
      get_def_use_mgr()->GetDef(op_ptr_type->GetSingleWordInOperand(1));
  uint32_t varType = context()->get_type_mgr()->FindPointerToType(
      op_type->result_id(), spv::StorageClass::Function);
  // Create new variable
  builder.SetInsertPoint(variable_insertion_point);
  Instruction* var =
      builder.AddVariable(varType, uint32_t(spv::StorageClass::Function));
  // Load access chain to the new variable before function call
  builder.SetInsertPoint(func_call_inst);

  uint32_t operand_id = operand_inst->result_id();
  Instruction* load = builder.AddLoad(op_type->result_id(), operand_id);
  builder.AddStore(var->result_id(), load->result_id());
  // Load return value to the acesschain after function call
  builder.SetInsertPoint(next_insert_point);
  load = builder.AddLoad(op_type->result_id(), var->result_id());
  builder.AddStore(operand_id, load->result_id());

  return var->result_id();
}